

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_definition.c
# Opt level: O1

void prf_instance_definition_entry_f(prf_node_t *node,prf_state_t *state)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  prf_node_t **pppVar4;
  
  if (node->opcode != prf_instance_definition_info.opcode) {
    prf_error(9,"instance definition entry state method tried on node of type %d.");
    return;
  }
  uVar1 = prf_array_count(state->instances);
  if ((int)uVar1 < 1) {
    uVar3 = 0;
  }
  else {
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      if (state->instances[uVar2] == node) break;
      uVar2 = uVar2 + 1;
      uVar3 = (ulong)uVar1;
    } while (uVar1 != uVar2);
  }
  if ((uint)uVar3 == uVar1) {
    pppVar4 = (prf_node_t **)prf_array_append_ptr(state->instances,node);
    state->instances = pppVar4;
  }
  return;
}

Assistant:

static void
prf_instance_definition_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    int i, n;
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_instance_definition_info.opcode ) {
        prf_error( 9, "instance definition entry state method tried "
                   "on node of type %d.", node->opcode );
        return;
    }
    n = prf_array_count( state->instances );
    for ( i = 0; i < n; i++ )
        if (state->instances[i] == node) break;
    if ( i == n )
        state->instances =
           (prf_node_t **) prf_array_append_ptr( state->instances, node );
}